

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O1

void omp_target_free(void *device_ptr,int device_num)

{
  bool bVar1;
  
  if (device_ptr != (void *)0x0) {
    if (device_num == -10) {
      free(device_ptr);
      return;
    }
    bVar1 = device_is_ready(device_num);
    if (bVar1) {
      (*(Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
         super__Vector_impl_data._M_start[device_num].RTL)->data_delete)
                (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_start[device_num].RTLDeviceID,device_ptr);
      return;
    }
  }
  return;
}

Assistant:

EXTERN void omp_target_free(void *device_ptr, int device_num) {
  DP("Call to omp_target_free for device %d and address " DPxMOD "\n",
      device_num, DPxPTR(device_ptr));

  if (!device_ptr) {
    DP("Call to omp_target_free with NULL ptr\n");
    return;
  }

  if (device_num == omp_get_initial_device()) {
    free(device_ptr);
    DP("omp_target_free deallocated host ptr\n");
    return;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_free returns, nothing to do\n");
    return;
  }

  DeviceTy &Device = Devices[device_num];
  Device.RTL->data_delete(Device.RTLDeviceID, (void *)device_ptr);
  DP("omp_target_free deallocated device ptr\n");
}